

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptDate.cpp
# Opt level: O3

Var Js::JavascriptDate::EntryToLocaleDateString(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *scriptContext;
  EngineInterfaceObject *this;
  JavascriptFunction *pJVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  Var pvVar6;
  JavascriptDate *pJVar7;
  EngineExtensionObjectBase *pEVar8;
  JavascriptString *pJVar9;
  ThreadContext *pTVar10;
  ScriptContext *pSVar11;
  int in_stack_00000010;
  Arguments local_60;
  Arguments local_50;
  undefined1 local_40 [8];
  CallInfo callInfo_local;
  Var result;
  ArgumentReader args;
  
  pSVar11 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
            scriptContext.ptr;
  local_40 = (undefined1  [8])callInfo;
  ThreadContext::ProbeStack(pSVar11->threadContext,0xc00,pSVar11,(PVOID)0x0);
  if (in_stack_00000010 != callInfo._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptDate.cpp"
                                ,0x528,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00bb9525;
    *puVar5 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  pSVar11 = (ScriptContext *)local_40;
  result = (Var)callInfo;
  ArgumentReader::AdjustArguments((ArgumentReader *)&result,(CallInfo *)pSVar11);
  scriptContext =
       (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
       scriptContext.ptr;
  if (((ulong)local_40 & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    pSVar11 = (ScriptContext *)0x52b;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptDate.cpp"
                                ,0x52b,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) goto LAB_00bb9525;
    *puVar5 = 0;
  }
  if (((ulong)result & 0xffffff) != 0) {
    pSVar11 = (ScriptContext *)0x0;
    pvVar6 = Arguments::operator[]((Arguments *)&result,0);
    bVar3 = VarIs<Js::JavascriptDate>(pvVar6);
    if (bVar3) {
      pvVar6 = Arguments::operator[]((Arguments *)&result,0);
      pJVar7 = VarTo<Js::JavascriptDate>(pvVar6);
      if (((DAT_015991f0 == '\x01') && (bVar3 = ScriptContext::IsIntlEnabled(scriptContext), bVar3))
         && (this = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
                    super_JavascriptLibraryBase).engineInterfaceObject.ptr,
            this != (EngineInterfaceObject *)0x0)) {
        pEVar8 = EngineInterfaceObject::GetEngineExtension(this,EngineInterfaceExtensionKind_Intl);
        pJVar1 = *(JavascriptFunction **)&pEVar8[1].extensionKind;
        if (pJVar1 != (JavascriptFunction *)0x0) {
          pTVar10 = scriptContext->threadContext;
          bVar3 = pTVar10->reentrancySafeOrHandled;
          pTVar10->reentrancySafeOrHandled = true;
          local_60.Info = (Type)result;
          local_60.Values = (Type)args.super_Arguments.Info;
          pvVar6 = JavascriptFunction::CallFunction(pJVar1,&local_60);
LAB_00bb949e:
          pTVar10->reentrancySafeOrHandled = bVar3;
          return pvVar6;
        }
        JavascriptLibrary::InitializeIntlForDatePrototype
                  ((scriptContext->super_ScriptContextBase).javascriptLibrary);
        pJVar1 = *(JavascriptFunction **)&pEVar8[1].extensionKind;
        if (pJVar1 != (JavascriptFunction *)0x0) {
          pTVar10 = scriptContext->threadContext;
          bVar3 = pTVar10->reentrancySafeOrHandled;
          pTVar10->reentrancySafeOrHandled = true;
          local_50.Info = (Type)result;
          local_50.Values = (Type)args.super_Arguments.Info;
          pvVar6 = JavascriptFunction::CallFunction(pJVar1,&local_50);
          goto LAB_00bb949e;
        }
      }
      if (((ulong)result & 0xffffff) == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptDate.cpp"
                                    ,0x558,"(args.Info.Count > 0)","Negative argument count");
        if (!bVar3) {
LAB_00bb9525:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar5 = 0;
      }
      pJVar9 = DateImplementation::GetString
                         (&pJVar7->m_date,(DateStringFormat)0x1,scriptContext,(DateTimeFlag)0x1);
      return pJVar9;
    }
  }
  callInfo_local = (CallInfo)0x0;
  BVar4 = TryInvokeRemotely(EntryToLocaleDateString,pSVar11,(Arguments *)&result,
                            (Var *)&callInfo_local);
  if (BVar4 != 0) {
    return (Var)callInfo_local;
  }
  JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec3d,L"Date.prototype.toLocaleDateString");
}

Assistant:

Var JavascriptDate::EntryToLocaleDateString(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        Assert(!(callInfo.Flags & CallFlags_New));

        if (args.Info.Count == 0 || !VarIs<JavascriptDate>(args[0]))
        {
            Var result = nullptr;
            if (TryInvokeRemotely(EntryToLocaleDateString, scriptContext, args, &result))
            {
                return result;
            }
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedDate, _u("Date.prototype.toLocaleDateString"));
        }
        JavascriptDate* date = VarTo<JavascriptDate>(args[0]);

#ifdef ENABLE_INTL_OBJECT
        if (CONFIG_FLAG(IntlBuiltIns) && scriptContext->IsIntlEnabled()){

            EngineInterfaceObject* nativeEngineInterfaceObj = scriptContext->GetLibrary()->GetEngineInterfaceObject();
            if (nativeEngineInterfaceObj)
            {
                IntlEngineInterfaceExtensionObject* extensionObject = static_cast<IntlEngineInterfaceExtensionObject*>(nativeEngineInterfaceObj->GetEngineExtension(EngineInterfaceExtensionKind_Intl));
                JavascriptFunction* func = extensionObject->GetDateToLocaleDateString();
                if (func)
                {
                    BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                    {
                        return func->CallFunction(args);
                    }
                    END_SAFE_REENTRANT_CALL
                }

                // Initialize Date.prototype.toLocaleDateString
                scriptContext->GetLibrary()->InitializeIntlForDatePrototype();
                func = extensionObject->GetDateToLocaleDateString();
                if (func)
                {
                    BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                    {
                        return func->CallFunction(args);
                    }
                    END_SAFE_REENTRANT_CALL
                }
            }
        }
#endif

        AssertMsg(args.Info.Count > 0, "Negative argument count");
        return date->m_date.GetString(
            DateImplementation::DateStringFormat::Locale, scriptContext,
            DateImplementation::DateTimeFlag::NoTime);
    }